

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O1

void __thiscall UUID_ParseStringBadLength_Test::TestBody(UUID_ParseStringBadLength_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  uuid __1;
  TrueWithString gtest_msg;
  maybe<pstore::uuid,_void> v1;
  string input1;
  uuid _;
  AssertHelper local_d0;
  Message local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0 [3];
  long *local_a8 [2];
  string local_98;
  undefined4 local_78;
  maybe<pstore::uuid,_void> local_6d;
  undefined4 local_5c;
  string local_58;
  uuid local_38;
  
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"00000000-0000-0000-0000-00000000000000","");
  pstore::uuid::from_string(&local_6d,&local_58);
  local_c8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)(local_6d.valid_ ^ 1);
  local_c0[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_6d.valid_ != false) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_c8,(AssertionResult *)"v1.has_value ()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x3d,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8[0] !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*local_a8[0] + 8))();
    }
  }
  if (local_c0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,local_c0[0]);
  }
  pstore::get_error_category();
  local_78 = 0xf;
  paVar1 = &local_98.field_2;
  local_98.field_2._8_8_ = 0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    pstore::uuid::uuid(&local_38,&local_58);
  }
  std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)local_98._M_string_length,0x20ade2);
  testing::Message::Message(&local_c8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,local_98._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_a8,&local_c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a8);
  if ((long *)CONCAT71(local_c8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._1_7_,
                       local_c8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_1_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_c8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._1_7_,
                                   local_c8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_1_) + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_6d.valid_ == true) {
    local_6d.valid_ = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"00000000-0000-0000-0000-0000000000","");
  pstore::uuid::from_string(&local_6d,&local_58);
  local_c8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)(local_6d.valid_ ^ 1);
  local_c0[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_6d.valid_ != false) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_c8,(AssertionResult *)"v2.has_value ()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_uuid.cpp"
               ,0x45,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a8[0] !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*local_a8[0] + 8))();
    }
  }
  if (local_c0[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,local_c0[0]);
  }
  pstore::get_error_category();
  local_5c = 0xf;
  local_98.field_2._8_8_ = 0;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity = 0;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    pstore::uuid::uuid((uuid *)local_a8,&local_58);
  }
  std::__cxx11::string::_M_replace((ulong)&local_98,0,(char *)local_98._M_string_length,0x20ade2);
  testing::Message::Message(&local_c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/common/check_for_error.hpp"
             ,0x28,local_98._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
  testing::internal::AssertHelper::~AssertHelper(&local_d0);
  if ((long *)CONCAT71(local_c8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._1_7_,
                       local_c8.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_1_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_c8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._1_7_,
                                   local_c8.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_1_) + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_6d.valid_ == true) {
    local_6d.valid_ = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST (UUID, FromNativeType) {
    uuid_t native{0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77,
                  0x88, 0x99, 0xaa, 0xbb, 0xcc, 0xdd, 0xee, 0xff};
    pstore::uuid const expected{"00112233-4455-6677-8899-aabbccddeeff"};
    pstore::uuid actual{native};
    EXPECT_EQ (expected, actual);
}